

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O2

int __thiscall spdlog::details::file_helper::open(file_helper *this,char *__file,int __oflag,...)

{
  filename_t *this_00;
  bool bVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int *piVar2;
  int tries;
  int iVar3;
  FILE *tmp;
  filename_t local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  close(this,(int)__file);
  this_00 = &this->filename_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__file);
  if ((this->event_handlers_).before_open.super__Function_base._M_manager != (_Manager_type)0x0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&this->event_handlers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  }
  iVar3 = 0;
  do {
    if (this->open_tries_ <= iVar3) {
      details::os::filename_to_str(&local_50,this_00);
      std::operator+(&local_70,"Failed opening file ",&local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                     &local_70," for writing");
      piVar2 = __errno_location();
      throw_spdlog_ex((string *)&local_90,*piVar2);
    }
    details::os::dir_name(&local_90,(filename_t *)__file);
    details::os::create_dir(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if ((char)__oflag == '\0') {
LAB_00319db2:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"ab",(allocator<char> *)&local_70);
      bVar1 = details::os::fopen_s(&this->fd_,(filename_t *)__file,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (!bVar1) {
        iVar3 = extraout_EAX;
        if ((this->event_handlers_).after_open.super__Function_base._M_manager != (_Manager_type)0x0
           ) {
          std::
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,__IO_FILE_*)>
          ::operator()(&(this->event_handlers_).after_open,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       this->fd_);
          iVar3 = extraout_EAX_00;
        }
        return iVar3;
      }
      details::os::sleep_for_millis(this->open_interval_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"wb",(allocator<char> *)&local_50);
      bVar1 = details::os::fopen_s((FILE **)&local_70,(filename_t *)__file,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (!bVar1) {
        fclose((FILE *)local_70._M_dataplus._M_p);
        goto LAB_00319db2;
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

SPDLOG_INLINE void file_helper::open(const filename_t &fname, bool truncate) {
    close();
    filename_ = fname;

    auto *mode = SPDLOG_FILENAME_T("ab");
    auto *trunc_mode = SPDLOG_FILENAME_T("wb");

    if (event_handlers_.before_open) {
        event_handlers_.before_open(filename_);
    }
    for (int tries = 0; tries < open_tries_; ++tries) {
        // create containing folder if not exists already.
        os::create_dir(os::dir_name(fname));
        if (truncate) {
            // Truncate by opening-and-closing a tmp file in "wb" mode, always
            // opening the actual log-we-write-to in "ab" mode, since that
            // interacts more politely with eternal processes that might
            // rotate/truncate the file underneath us.
            std::FILE *tmp;
            if (os::fopen_s(&tmp, fname, trunc_mode)) {
                continue;
            }
            std::fclose(tmp);
        }
        if (!os::fopen_s(&fd_, fname, mode)) {
            if (event_handlers_.after_open) {
                event_handlers_.after_open(filename_, fd_);
            }
            return;
        }

        details::os::sleep_for_millis(open_interval_);
    }

    throw_spdlog_ex("Failed opening file " + os::filename_to_str(filename_) + " for writing",
                    errno);
}